

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O1

void VP8InitDithering(WebPDecoderOptions *options,VP8Decoder *dec)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  if (options != (WebPDecoderOptions *)0x0) {
    iVar1 = options->dithering_strength;
    if (iVar1 < 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0xff;
      if (iVar1 < 0x65) {
        uVar3 = (uint)(iVar1 * 0xff) / 100;
      }
    }
    if (uVar3 != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        uVar2 = *(uint *)((long)dec->dqm_[0].uv_mat_ + lVar6 + 8);
        if ((int)uVar2 < 0xc) {
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          *(uint *)((long)dec->dqm_[0].uv_mat_ + lVar6 + 0xc) =
               "\b\a\x06\x04\x04\x02\x02\x02\x01\x01\x01\x01"[uVar2] * uVar3 >> 3;
        }
        uVar5 = uVar5 | *(uint *)((long)dec->dqm_[0].uv_mat_ + lVar6 + 0xc);
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x80);
      if (uVar5 != 0) {
        VP8InitRandom(&dec->dithering_rg_,1.0);
        dec->dither_ = 1;
      }
    }
    iVar1 = options->alpha_dithering_strength;
    dec->alpha_dithering_ = iVar1;
    iVar4 = 100;
    if (iVar1 < 0x65) {
      if (-1 < iVar1) {
        return;
      }
      iVar4 = 0;
    }
    dec->alpha_dithering_ = iVar4;
  }
  return;
}

Assistant:

void VP8InitDithering(const WebPDecoderOptions* const options,
                      VP8Decoder* const dec) {
  assert(dec != NULL);
  if (options != NULL) {
    const int d = options->dithering_strength;
    const int max_amp = (1 << VP8_RANDOM_DITHER_FIX) - 1;
    const int f = (d < 0) ? 0 : (d > 100) ? max_amp : (d * max_amp / 100);
    if (f > 0) {
      int s;
      int all_amp = 0;
      for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
        VP8QuantMatrix* const dqm = &dec->dqm_[s];
        if (dqm->uv_quant_ < DITHER_AMP_TAB_SIZE) {
          const int idx = (dqm->uv_quant_ < 0) ? 0 : dqm->uv_quant_;
          dqm->dither_ = (f * kQuantToDitherAmp[idx]) >> 3;
        }
        all_amp |= dqm->dither_;
      }
      if (all_amp != 0) {
        VP8InitRandom(&dec->dithering_rg_, 1.0f);
        dec->dither_ = 1;
      }
    }
    // potentially allow alpha dithering
    dec->alpha_dithering_ = options->alpha_dithering_strength;
    if (dec->alpha_dithering_ > 100) {
      dec->alpha_dithering_ = 100;
    } else if (dec->alpha_dithering_ < 0) {
      dec->alpha_dithering_ = 0;
    }
  }
}